

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_char_&,_const_char_&> * __thiscall
Catch::ExprLhs<char_const&>::operator==
          (BinaryExpr<const_char_&,_const_char_&> *__return_storage_ptr__,ExprLhs<char_const&> *this
          ,char *rhs)

{
  char *lhs;
  bool comparisonResult;
  StringRef local_30;
  char *local_20;
  char *rhs_local;
  ExprLhs<const_char_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (char *)this;
  this_local = (ExprLhs<const_char_&> *)__return_storage_ptr__;
  comparisonResult = compareEqual<char,char>(*(char **)this,rhs);
  lhs = *(char **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_char_&,_const_char_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }